

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O2

void __thiscall ChatRoom::message(ChatRoom *this,string *origin,string *dest,string *message)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  _Var3;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  __it;
  long lVar4;
  string *local_50;
  shared_ptr<Person> *local_48;
  string *local_40;
  string *local_38;
  
  __it._M_current =
       (this->m_people).
       super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->m_people).
             super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_48 - (long)__it._M_current;
  local_50 = dest;
  local_40 = origin;
  local_38 = message;
  for (lVar2 = lVar4 >> 6; _Var3._M_current = __it._M_current, 0 < lVar2; lVar2 = lVar2 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_50,__it);
    if (bVar1) goto LAB_00102629;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_50,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00102629;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_50,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00102629;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_50,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00102629;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var3._M_current = local_48;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                                *)&local_50,__it), _Var3._M_current = __it._M_current, bVar1))
      goto LAB_00102629;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_50,_Var3);
    if (bVar1) goto LAB_00102629;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                        *)&local_50,__it);
  _Var3._M_current = local_48;
  if (bVar1) {
    _Var3._M_current = __it._M_current;
  }
LAB_00102629:
  if (_Var3._M_current ==
      (this->m_people).
      super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    return;
  }
  Person::recieve(((_Var3._M_current)->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr,local_40,local_38);
  return;
}

Assistant:

void ChatRoom::message(const std::string& origin, const std::string& dest, const std::string& message)
{
	auto it{std::find_if(m_people.begin(), m_people.end(), [&dest] (const auto& p)
			{
				return p->m_name == dest;
			})};

	if(it != m_people.end())
	{
		(*it)->recieve(origin, message);
	};
}